

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall test_im2col::vars_abi_cxx11_(string *__return_storage_ptr__,test_im2col *this)

{
  string sStack_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  string local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  string local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str_abi_cxx11_(&local_38,this->type_input);
  std::operator+(&local_2f8,"type_input=",&local_38);
  std::operator+(&local_2d8,&local_2f8,",");
  var_to_str_abi_cxx11_(&local_338,this->type_kernel);
  std::operator+(&local_318,"type_kernel=",&local_338);
  std::operator+(&local_2b8,&local_2d8,&local_318);
  std::operator+(&local_298,&local_2b8,",");
  var_to_str_abi_cxx11_(&local_378,this->dst_type);
  std::operator+(&local_358,"dst_type=",&local_378);
  std::operator+(&local_278,&local_298,&local_358);
  std::operator+(&local_258,&local_278,",");
  var_to_str<long,4ul>(&local_3b8,&this->ne_input);
  std::operator+(&local_398,"ne_input=",&local_3b8);
  std::operator+(&local_238,&local_258,&local_398);
  std::operator+(&local_218,&local_238,",");
  var_to_str<long,4ul>(&local_3f8,&this->ne_kernel);
  std::operator+(&local_3d8,"ne_kernel=",&local_3f8);
  std::operator+(&local_1f8,&local_218,&local_3d8);
  std::operator+(&local_1d8,&local_1f8,",");
  var_to_str<int>(&local_438,&this->s0);
  std::operator+(&local_418,"s0=",&local_438);
  std::operator+(&local_1b8,&local_1d8,&local_418);
  std::operator+(&local_198,&local_1b8,",");
  var_to_str<int>(&local_478,&this->s1);
  std::operator+(&local_458,"s1=",&local_478);
  std::operator+(&local_178,&local_198,&local_458);
  std::operator+(&local_158,&local_178,",");
  var_to_str<int>(&local_4b8,&this->p0);
  std::operator+(&local_498,"p0=",&local_4b8);
  std::operator+(&local_138,&local_158,&local_498);
  std::operator+(&local_118,&local_138,",");
  var_to_str<int>(&local_4f8,&this->p1);
  std::operator+(&local_4d8,"p1=",&local_4f8);
  std::operator+(&local_f8,&local_118,&local_4d8);
  std::operator+(&local_d8,&local_f8,",");
  var_to_str<int>(&local_538,&this->d0);
  std::operator+(&local_518,"d0=",&local_538);
  std::operator+(&local_b8,&local_d8,&local_518);
  std::operator+(&local_98,&local_b8,",");
  var_to_str<int>(&local_578,&this->d1);
  std::operator+(&local_558,"d1=",&local_578);
  std::operator+(&local_78,&local_98,&local_558);
  std::operator+(&local_58,&local_78,",");
  var_to_str<bool>(&sStack_5b8,&this->is_2D);
  std::operator+(&local_598,"is_2D=",&sStack_5b8);
  std::operator+(__return_storage_ptr__,&local_58,&local_598);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&sStack_5b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR12(type_input, type_kernel, dst_type, ne_input, ne_kernel, s0, s1, p0, p1, d0, d1, is_2D);
    }